

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

void libcellml::updateComponentsVariablesUnitsNames
               (string *name,ComponentPtr *component,UnitsPtr *units)

{
  element_type *name_00;
  element_type *name_01;
  bool bVar1;
  __type _Var2;
  size_t sVar3;
  ulong uVar4;
  ModelPtr importModel;
  VariablePtr variable;
  ComponentPtr childComponent;
  ComponentPtr importComponent;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  uVar4 = 0;
  while( true ) {
    sVar3 = Component::variableCount
                      ((component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    if (sVar3 <= uVar4) break;
    Component::variable((Component *)&variable,
                        (size_t)(component->
                                super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr);
    bVar1 = ImportedEntity::isImport
                      (&((component->
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->super_ImportedEntity);
    if (bVar1) {
      ImportedEntity::importSource((ImportedEntity *)&childComponent);
      ImportSource::model((ImportSource *)&importModel);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&childComponent.
                  super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      name_00 = importModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ImportedEntity::importReference_abi_cxx11_
                ((string *)&childComponent,
                 &((component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)
                  ._M_ptr)->super_ImportedEntity);
      ComponentEntity::component
                ((ComponentEntity *)&importComponent,(string *)name_00,
                 SUB81((string *)&childComponent,0));
      std::__cxx11::string::~string((string *)&childComponent);
      name_01 = importComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      NamedEntity::name_abi_cxx11_
                ((string *)&childComponent,
                 &(variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->super_NamedEntity);
      Component::variable((Component *)&stack0xffffffffffffffc0,(string *)name_01);
      std::__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *)
                 &stack0xffffffffffffffc0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
      std::__cxx11::string::~string((string *)&childComponent);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&importComponent.
                  super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&importModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    Variable::units((Variable *)&importModel);
    NamedEntity::name_abi_cxx11_
              ((string *)&childComponent,
               (NamedEntity *)
               importModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    _Var2 = std::operator==((string *)&childComponent,name);
    std::__cxx11::string::~string((string *)&childComponent);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&importModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (_Var2) {
      Variable::setUnits(variable.
                         super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         units);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    uVar4 = uVar4 + 1;
  }
  uVar4 = 0;
  while( true ) {
    sVar3 = ComponentEntity::componentCount
                      (&((component->
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->super_ComponentEntity);
    if (sVar3 <= uVar4) break;
    ComponentEntity::component
              ((ComponentEntity *)&childComponent,
               (size_t)(component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    updateComponentsVariablesUnitsNames(name,&childComponent,units);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&childComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void updateComponentsVariablesUnitsNames(const std::string &name, const ComponentPtr &component, const UnitsPtr &units)
{
    for (size_t variableIndex = 0; variableIndex < component->variableCount(); ++variableIndex) {
        auto variable = component->variable(variableIndex);
        if (component->isImport()) {
            auto importModel = component->importSource()->model();
            auto importComponent = importModel->component(component->importReference());
            variable = importComponent->variable(variable->name());
        }
        if (variable->units()->name() == name) {
            variable->setUnits(units);
        }
    }
    for (size_t index = 0; index < component->componentCount(); ++index) {
        auto childComponent = component->component(index);
        updateComponentsVariablesUnitsNames(name, childComponent, units);
    }
}